

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O0

iterator __thiscall CP::list<int>::erase(list<int> *this,iterator it)

{
  ostream *this_00;
  list<int> *this_local;
  iterator it_local;
  iterator tmp;
  
  if ((this->mCheck & 1U) != 0) {
    this_00 = std::operator<<((ostream *)&std::cout,"WRONG FUNCTION CALL");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  list_iterator::list_iterator(&it_local,(it.ptr)->next);
  (it.ptr)->prev->next = (it.ptr)->next;
  (it.ptr)->next->prev = (it.ptr)->prev;
  if (it.ptr != (node *)0x0) {
    operator_delete(it.ptr,0x18);
  }
  this->mSize = this->mSize - 1;
  return (iterator)it_local.ptr;
}

Assistant:

iterator erase(iterator it) {
      if (mCheck) std::cout << "WRONG FUNCTION CALL" << std::endl;
      iterator tmp(it.ptr->next);
      it.ptr->prev->next = it.ptr->next;
      it.ptr->next->prev = it.ptr->prev;
      delete it.ptr;
      mSize--;
      return tmp;
    }